

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

bool llama_model_load(string *fname,llama_model *model,gpt_vocab *vocab,int n_ctx)

{
  uint uVar1;
  mapped_type pgVar2;
  void *pvVar3;
  FILE *pFVar4;
  ggml_type gVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  uint *puVar15;
  mapped_type *pmVar16;
  ulong uVar17;
  ggml_context *pgVar18;
  ggml_tensor *pgVar19;
  mapped_type *ppgVar20;
  size_t sVar21;
  size_t sVar22;
  reference pvVar23;
  size_type sVar24;
  long lVar25;
  uint in_ECX;
  uint *in_RSI;
  string *in_RDI;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  size_t offset_row_1;
  int i1_1;
  size_t row_size_1;
  int np1;
  size_t offset;
  size_t offset_row;
  int i1;
  size_t row_size;
  int np0;
  size_t bpe;
  mapped_type tensor;
  int split_type;
  string name;
  int i_3;
  int32_t ne [2];
  int32_t nelements;
  int32_t ftype;
  int32_t length;
  int32_t n_dims;
  size_t total_size;
  int n_tensors;
  ggml_init_params in_stack_000008c8;
  string fname_part;
  int part_id;
  int i_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp;
  size_t file_offset;
  size_t memory_size;
  int n_elements;
  int n_mem;
  int n_ctx_3;
  int n_layer_2;
  int n_embd_2;
  llama_hparams *hparams_3;
  value_type *layer;
  int i_1;
  int n_vocab_2;
  int n_ctx_2;
  int n_layer_1;
  int n_embd_1;
  llama_hparams *hparams_2;
  ggml_init_params params;
  int n_vocab_1;
  int n_ctx_1;
  int n_layer;
  int n_embd;
  llama_hparams *hparams_1;
  size_t ctx_size;
  ggml_context **ctx;
  ggml_type wtype2;
  ggml_type wtype;
  uint32_t len;
  int i;
  string word;
  int32_t n_vocab;
  llama_hparams *hparams;
  int n_parts;
  int n_ff;
  uint32_t magic;
  ifstream fin;
  vector<char,_std::allocator<char>_> f_buf;
  ggml_type in_stack_ffffffffffffef98;
  ggml_type in_stack_ffffffffffffef9c;
  ggml_type in_stack_ffffffffffffefa0;
  int in_stack_ffffffffffffefa4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa8;
  ggml_context *in_stack_ffffffffffffefb0;
  key_type *in_stack_ffffffffffffefb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefc0;
  int in_stack_ffffffffffffefd0;
  int in_stack_ffffffffffffefd4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefe0;
  long in_stack_ffffffffffffefe8;
  float local_c7c;
  float local_c6c;
  float local_c58;
  float local_c40;
  float local_c28;
  float local_c10;
  float local_bf8;
  float local_be0;
  float local_bc8;
  float local_bb0;
  float local_b98;
  float local_b84;
  float local_b74;
  float local_b64;
  int local_ad4;
  int local_aac;
  size_t local_a98;
  allocator<char> local_a89 [33];
  ggml_tensor *local_a68;
  uint local_a5c;
  _Self local_a58;
  allocator<char> local_a49 [33];
  _Self local_a28;
  allocator<char> local_a19 [37];
  int local_9f4;
  ggml_type local_9f0 [3];
  uint local_9e4;
  undefined1 local_9e0 [4];
  int local_9dc;
  long local_9d8;
  uint local_9cc;
  undefined8 local_9c8;
  undefined8 local_9c0;
  ifstream local_9b8 [584];
  string local_770 [32];
  int local_750;
  int local_74c;
  undefined1 local_730 [16];
  streamoff local_720;
  long local_718;
  int local_70c;
  uint local_708;
  uint local_704;
  uint local_700;
  uint local_6fc;
  uint *local_6f8;
  reference local_390;
  int local_388;
  allocator<char> local_381 [40];
  allocator<char> local_359 [40];
  allocator<char> local_331 [33];
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint *local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  long local_2e8;
  undefined8 uStack_2e0;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint *local_2c8;
  ulong local_2c0;
  uint *local_2b8;
  undefined4 local_2b0;
  ggml_type local_2ac;
  undefined1 local_2a8 [4];
  int local_2a4;
  uint local_27c;
  uint *local_278;
  uint local_270;
  int local_26c;
  int local_268;
  int local_264;
  long local_260 [67];
  allocator<char> local_41;
  vector<char,_std::allocator<char>_> local_40;
  uint local_24;
  uint *local_18;
  string *local_10;
  byte local_1;
  
  pFVar4 = _stderr;
  local_24 = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
  fprintf(pFVar4,"%s: loading model from \'%s\' - please wait ...\n","llama_model_load",pcVar13);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffefc0,
             (size_type)in_stack_ffffffffffffefb8,(allocator_type *)in_stack_ffffffffffffefb0);
  std::allocator<char>::~allocator(&local_41);
  std::ifstream::ifstream(local_260,local_10,_S_bin);
  pcVar13 = (char *)std::ifstream::rdbuf();
  pcVar14 = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0x1079fb);
  std::vector<char,_std::allocator<char>_>::size(&local_40);
  std::streambuf::pubsetbuf(pcVar13,(long)pcVar14);
  bVar6 = std::ios::operator!((ios *)((long)local_260 + *(long *)(local_260[0] + -0x18)));
  pFVar4 = _stderr;
  if ((bVar6 & 1) == 0) {
    std::istream::read((char *)local_260,(long)&local_268);
    pFVar4 = _stderr;
    if (local_268 == 0x67676d6c) {
      local_26c = 0;
      local_270 = 0;
      local_278 = local_18;
      std::istream::read((char *)local_260,(long)local_18);
      std::istream::read((char *)local_260,(long)(local_278 + 2));
      std::istream::read((char *)local_260,(long)(local_278 + 3));
      std::istream::read((char *)local_260,(long)(local_278 + 4));
      std::istream::read((char *)local_260,(long)(local_278 + 5));
      std::istream::read((char *)local_260,(long)(local_278 + 6));
      std::istream::read((char *)local_260,(long)(local_278 + 7));
      local_278[1] = local_24;
      uVar1 = local_278[3];
      local_26c = ((int)((uVar1 - 1) + (int)(local_278[2] << 3) / 3) / (int)uVar1) * uVar1;
      puVar15 = (uint *)std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        at((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
      pFVar4 = _stderr;
      local_270 = *puVar15;
      local_27c = *local_18;
      if (local_27c == *local_18) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffefb0);
        for (local_2a4 = 0; local_2a4 < (int)local_27c; local_2a4 = local_2a4 + 1) {
          std::istream::read((char *)local_260,(long)local_2a8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                     CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
          pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x107e0b);
          std::istream::read((char *)local_260,(long)pcVar13);
          iVar8 = local_2a4;
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
          *pmVar16 = iVar8;
          std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffefe0,(key_type *)in_stack_ffffffffffffefd8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
        pFVar4 = _stderr;
        local_2ac = GGML_TYPE_COUNT;
        switch(local_18[7]) {
        case 0:
          local_2ac = GGML_TYPE_F32;
          break;
        case 1:
          local_2ac = GGML_TYPE_F16;
          break;
        case 2:
          local_2ac = GGML_TYPE_Q4_0;
          break;
        case 3:
          local_2ac = GGML_TYPE_Q4_1;
          break;
        default:
          pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
          fprintf(pFVar4,"%s: invalid model file \'%s\' (bad f16 value %d)\n","llama_model_load",
                  pcVar13,(ulong)local_18[7]);
          local_1 = 0;
          local_264 = 1;
          goto LAB_0010b669;
        }
        local_2b0 = 6;
        local_2b8 = local_18 + 0x18;
        local_2c0 = 0;
        local_2c8 = local_18;
        local_2cc = local_18[2];
        local_2d0 = local_18[5];
        local_2d4 = local_18[1];
        local_2d8 = *local_18;
        iVar8 = local_2cc * local_2d8;
        fVar26 = ggml_type_sizef(local_2ac);
        local_b64 = (float)local_2c0;
        local_b64 = (float)iVar8 * fVar26 + local_b64;
        local_2c0 = (ulong)local_b64;
        local_2c0 = local_2c0 | (long)(local_b64 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2cc;
        fVar27 = ggml_type_sizef(GGML_TYPE_F32);
        local_b74 = (float)local_2c0;
        local_b74 = fVar26 * fVar27 + local_b74;
        local_2c0 = (ulong)local_b74;
        local_2c0 = local_2c0 | (long)(local_b74 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        iVar8 = local_2cc * local_2d8;
        fVar26 = ggml_type_sizef(local_2ac);
        local_b84 = (float)local_2c0;
        local_b84 = (float)iVar8 * fVar26 + local_b84;
        local_2c0 = (ulong)local_b84;
        local_2c0 = local_2c0 | (long)(local_b84 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        fVar27 = (float)(int)local_2cc;
        fVar28 = ggml_type_sizef(GGML_TYPE_F32);
        local_b98 = (float)local_2c0;
        local_b98 = fVar26 * fVar27 * fVar28 + local_b98;
        local_2c0 = (ulong)local_b98;
        local_2c0 = local_2c0 | (long)(local_b98 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        iVar8 = local_2cc * local_2cc;
        fVar27 = ggml_type_sizef(local_2ac);
        local_bb0 = (float)local_2c0;
        local_bb0 = fVar26 * (float)iVar8 * fVar27 + local_bb0;
        local_2c0 = (ulong)local_bb0;
        local_2c0 = local_2c0 | (long)(local_bb0 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        iVar8 = local_2cc * local_2cc;
        fVar27 = ggml_type_sizef(local_2ac);
        local_bc8 = (float)local_2c0;
        local_bc8 = fVar26 * (float)iVar8 * fVar27 + local_bc8;
        local_2c0 = (ulong)local_bc8;
        local_2c0 = local_2c0 | (long)(local_bc8 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        iVar8 = local_2cc * local_2cc;
        fVar27 = ggml_type_sizef(local_2ac);
        local_be0 = (float)local_2c0;
        local_be0 = fVar26 * (float)iVar8 * fVar27 + local_be0;
        local_2c0 = (ulong)local_be0;
        local_2c0 = local_2c0 | (long)(local_be0 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        iVar8 = local_2cc * local_2cc;
        fVar27 = ggml_type_sizef(local_2ac);
        local_bf8 = (float)local_2c0;
        local_bf8 = fVar26 * (float)iVar8 * fVar27 + local_bf8;
        local_2c0 = (ulong)local_bf8;
        local_2c0 = local_2c0 | (long)(local_bf8 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        fVar27 = (float)(int)local_2cc;
        fVar28 = ggml_type_sizef(GGML_TYPE_F32);
        local_c10 = (float)local_2c0;
        local_c10 = fVar26 * fVar27 * fVar28 + local_c10;
        local_2c0 = (ulong)local_c10;
        local_2c0 = local_2c0 | (long)(local_c10 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        iVar8 = local_26c * local_2cc;
        fVar27 = ggml_type_sizef(local_2ac);
        local_c28 = (float)local_2c0;
        local_c28 = fVar26 * (float)iVar8 * fVar27 + local_c28;
        local_2c0 = (ulong)local_c28;
        local_2c0 = local_2c0 | (long)(local_c28 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        iVar8 = local_26c * local_2cc;
        fVar27 = ggml_type_sizef(local_2ac);
        local_c40 = (float)local_2c0;
        local_c40 = fVar26 * (float)iVar8 * fVar27 + local_c40;
        local_2c0 = (ulong)local_c40;
        local_2c0 = local_2c0 | (long)(local_c40 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        fVar26 = (float)(int)local_2d0;
        iVar8 = local_26c * local_2cc;
        fVar27 = ggml_type_sizef(local_2ac);
        local_c58 = (float)local_2c0;
        local_c58 = fVar26 * (float)iVar8 * fVar27 + local_c58;
        local_2c0 = (ulong)local_c58;
        local_2c0 = local_2c0 | (long)(local_c58 - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        iVar8 = local_2d4 * local_2d0 * local_2cc;
        fVar26 = ggml_type_sizef(GGML_TYPE_F32);
        local_c6c = (float)local_2c0;
        local_c6c = (float)iVar8 * fVar26 + local_c6c;
        local_2c0 = (ulong)local_c6c;
        local_2c0 = local_2c0 | (long)(local_c6c - 9.223372e+18) & (long)local_2c0 >> 0x3f;
        iVar8 = local_2d4 * local_2d0 * local_2cc;
        fVar26 = ggml_type_sizef(GGML_TYPE_F32);
        local_c7c = (float)local_2c0;
        local_c7c = (float)iVar8 * fVar26 + local_c7c;
        uVar17 = (ulong)local_c7c;
        local_2c0 = (uVar17 | (long)(local_c7c - 9.223372e+18) & (long)uVar17 >> 0x3f) +
                    (long)(int)(local_2d0 * 0xa00 + 0x500);
        auVar29._8_4_ = (int)(local_2c0 >> 0x20);
        auVar29._0_8_ = local_2c0;
        auVar29._12_4_ = 0x45300000;
        fprintf(_stderr,"%s: ggml ctx size = %6.2f MB\n",
                ((auVar29._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_2c0) - 4503599627370496.0)) *
                9.5367431640625e-07,"llama_model_load");
        local_2e8 = local_2c0;
        uStack_2e0 = 0;
        local_2f8 = local_2c0;
        uStack_2f0 = 0;
        pgVar18 = ggml_init(in_stack_000008c8);
        *(ggml_context **)(local_18 + 0x18) = pgVar18;
        if (*(long *)(local_18 + 0x18) == 0) {
          fprintf(_stderr,"%s: ggml_init() failed\n","llama_model_load");
          local_1 = 0;
          local_264 = 1;
        }
        else {
          local_300 = local_18;
          local_304 = local_18[2];
          local_308 = local_18[5];
          local_30c = local_18[1];
          local_310 = *local_18;
          std::vector<llama_layer,_std::allocator<llama_layer>_>::resize
                    ((vector<llama_layer,_std::allocator<llama_layer>_> *)in_stack_ffffffffffffefc0,
                     (size_type)in_stack_ffffffffffffefb8);
          pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                       (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                       (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
          *(ggml_tensor **)(local_18 + 8) = pgVar19;
          pgVar19 = ggml_new_tensor_1d((ggml_context *)
                                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0)
                                       ,in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98);
          *(ggml_tensor **)(local_18 + 10) = pgVar19;
          pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                       (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                       (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
          *(ggml_tensor **)(local_18 + 0xc) = pgVar19;
          pgVar2 = *(mapped_type *)(local_18 + 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                     (allocator<char> *)
                     CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
          ppgVar20 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
          *ppgVar20 = pgVar2;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
          std::allocator<char>::~allocator(local_331);
          pgVar2 = *(mapped_type *)(local_18 + 10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                     (allocator<char> *)
                     CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
          ppgVar20 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
          *ppgVar20 = pgVar2;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
          std::allocator<char>::~allocator(local_359);
          pgVar2 = *(mapped_type *)(local_18 + 0xc);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                     (allocator<char> *)
                     CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
          ppgVar20 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
          *ppgVar20 = pgVar2;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
          std::allocator<char>::~allocator(local_381);
          for (local_388 = 0; local_388 < (int)local_308; local_388 = local_388 + 1) {
            local_390 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                                   (local_18 + 0xe),(long)local_388);
            pgVar19 = ggml_new_tensor_1d((ggml_context *)
                                         CONCAT44(in_stack_ffffffffffffefa4,
                                                  in_stack_ffffffffffffefa0),
                                         in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98);
            local_390->attention_norm = pgVar19;
            pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                         (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                         (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
            local_390->wq = pgVar19;
            pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                         (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                         (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
            local_390->wk = pgVar19;
            pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                         (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                         (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
            local_390->wv = pgVar19;
            pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                         (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                         (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
            local_390->wo = pgVar19;
            pgVar19 = ggml_new_tensor_1d((ggml_context *)
                                         CONCAT44(in_stack_ffffffffffffefa4,
                                                  in_stack_ffffffffffffefa0),
                                         in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98);
            local_390->ffn_norm = pgVar19;
            pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                         (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                         (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
            local_390->w1 = pgVar19;
            pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                         (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                         (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
            local_390->w2 = pgVar19;
            pgVar19 = ggml_new_tensor_2d(in_stack_ffffffffffffefb0,
                                         (ggml_type)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                                         (int)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4);
            local_390->w3 = pgVar19;
            pgVar19 = local_390->attention_norm;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->wq;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->wk;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->wv;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->wo;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->ffn_norm;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->w1;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->w2;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            pgVar19 = local_390->w3;
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
            std::operator+((char *)in_stack_ffffffffffffefa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::operator+(in_stack_ffffffffffffefa8,
                           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            ppgVar20 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            *ppgVar20 = pgVar19;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
          }
          local_6f8 = local_18;
          local_6fc = local_18[2];
          local_700 = local_18[5];
          local_704 = local_18[1];
          local_708 = local_700 * local_704;
          local_70c = local_6fc * local_708;
          pgVar19 = ggml_new_tensor_1d((ggml_context *)
                                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0)
                                       ,in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98);
          *(ggml_tensor **)(local_18 + 0x14) = pgVar19;
          pgVar19 = ggml_new_tensor_1d((ggml_context *)
                                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0)
                                       ,in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98);
          *(ggml_tensor **)(local_18 + 0x16) = pgVar19;
          sVar21 = ggml_nbytes((ggml_tensor *)0x10a118);
          sVar22 = ggml_nbytes((ggml_tensor *)0x10a133);
          local_718 = sVar21 + sVar22;
          auVar30._8_4_ = (int)((ulong)local_718 >> 0x20);
          auVar30._0_8_ = local_718;
          auVar30._12_4_ = 0x45300000;
          fprintf(_stderr,"%s: memory_size = %8.2f MB, n_mem = %d\n",
                  ((auVar30._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_718) - 4503599627370496.0)) * 0.0009765625
                  * 0.0009765625,"llama_model_load",(ulong)local_708);
          local_730 = std::istream::tellg();
          local_720 = std::fpos::operator_cast_to_long((fpos *)local_730);
          std::ifstream::close();
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10a23b);
          for (local_74c = 0; local_74c < (int)local_270; local_74c = local_74c + 1) {
            local_750 = local_74c;
            std::__cxx11::string::string(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
            if (0 < local_74c) {
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefe8 >> 0x20));
              std::operator+((char *)in_stack_ffffffffffffefa8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            }
            uVar1 = local_270;
            pFVar4 = _stderr;
            uVar9 = local_74c + 1;
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            fprintf(pFVar4,"%s: loading model part %d/%d from \'%s\'\n","llama_model_load",
                    (ulong)uVar9,(ulong)uVar1,pcVar13);
            std::ifstream::ifstream(local_9b8,local_770,_S_bin);
            std::ifstream::operator=(local_260,local_9b8);
            std::ifstream::~ifstream(local_9b8);
            pcVar13 = (char *)std::ifstream::rdbuf();
            pcVar14 = std::vector<char,_std::allocator<char>_>::data
                                ((vector<char,_std::allocator<char>_> *)0x10a44f);
            std::vector<char,_std::allocator<char>_>::size(&local_40);
            std::streambuf::pubsetbuf(pcVar13,(long)pcVar14);
            std::fpos<__mbstate_t>::fpos
                      ((fpos<__mbstate_t> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                       CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            std::istream::seekg(local_260,local_9c8,local_9c0);
            local_9cc = 0;
            local_9d8 = 0;
            fprintf(_stderr,"%s: ","llama_model_load");
            do {
              std::istream::read((char *)local_260,(long)&local_9dc);
              std::istream::read((char *)local_260,(long)local_9e0);
              std::istream::read((char *)local_260,(long)&local_9e4);
              bVar6 = std::ios::eof();
              if ((bVar6 & 1) != 0) {
                in_stack_ffffffffffffefa8 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stderr;
                fprintf(_stderr," done\n");
                auVar31._8_4_ = (int)((ulong)local_9d8 >> 0x20);
                auVar31._0_8_ = local_9d8;
                auVar31._12_4_ = 0x45300000;
                fprintf((FILE *)(in_stack_ffffffffffffefa8->_M_dataplus)._M_p,
                        "%s: model size = %8.2f MB / num tensors = %d\n",
                        ((auVar31._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_9d8) - 4503599627370496.0)) *
                        0.0009765625 * 0.0009765625,"llama_model_load",(ulong)local_9cc);
                std::ifstream::close();
                local_264 = 0;
                break;
              }
              local_9f0[2] = 1;
              local_9f0[0] = GGML_TYPE_Q4_1;
              local_9f0[1] = GGML_TYPE_Q4_1;
              for (local_9f4 = 0; local_9f4 < local_9dc; local_9f4 = local_9f4 + 1) {
                std::istream::read((char *)local_260,(long)(local_9f0 + local_9f4));
                local_9f0[2] = local_9f0[local_9f4] * local_9f0[2];
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffefc0,(size_type)in_stack_ffffffffffffefb8,
                         (char)((ulong)in_stack_ffffffffffffefb0 >> 0x38),
                         (allocator<char> *)in_stack_ffffffffffffefa8);
              std::allocator<char>::~allocator(local_a19);
              pvVar23 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                                   CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
              std::istream::read((char *)local_260,(long)pvVar23);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x10a6d2);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (allocator<char> *)
                         CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
              local_a28._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                          (key_type *)0x10a723);
              local_a58._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
              bVar7 = std::operator==(&local_a28,&local_a58);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
              std::allocator<char>::~allocator(local_a49);
              pFVar4 = _stderr;
              if (bVar7) {
                pcVar13 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x10a7bb);
                fprintf(pFVar4,"%s: unknown tensor \'%s\' in model file\n","llama_model_load",
                        pcVar13);
                local_1 = 0;
                local_264 = 1;
              }
              else {
                local_a5c = 0;
                sVar24 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   (in_stack_ffffffffffffefc0,(char *)in_stack_ffffffffffffefb8,
                                    (size_type)in_stack_ffffffffffffefb0);
                if (sVar24 == 0xffffffffffffffff) {
                  sVar24 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     (in_stack_ffffffffffffefc0,(char *)in_stack_ffffffffffffefb8,
                                      (size_type)in_stack_ffffffffffffefb0);
                  if (sVar24 == 0xffffffffffffffff) {
                    sVar24 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       (in_stack_ffffffffffffefc0,(char *)in_stack_ffffffffffffefb8,
                                        (size_type)in_stack_ffffffffffffefb0);
                    if (sVar24 != 0xffffffffffffffff) {
                      local_a5c = 1;
                    }
                  }
                  else {
                    sVar24 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       (in_stack_ffffffffffffefc0,(char *)in_stack_ffffffffffffefb8,
                                        (size_type)in_stack_ffffffffffffefb0);
                    if (sVar24 == 0xffffffffffffffff) {
                      sVar24 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               find(in_stack_ffffffffffffefc0,(char *)in_stack_ffffffffffffefb8,
                                    (size_type)in_stack_ffffffffffffefb0);
                      local_a5c = (uint)(sVar24 == 0xffffffffffffffff);
                    }
                    else {
                      local_a5c = 0;
                    }
                  }
                }
                else {
                  local_a5c = 0;
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10a985);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                           (allocator<char> *)
                           CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
                ppgVar20 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
                pgVar19 = *ppgVar20;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
                std::allocator<char>::~allocator(local_a89);
                local_a68 = pgVar19;
                if (local_9dc == 1) {
                  iVar8 = ggml_nelements(pgVar19);
                  pFVar4 = _stderr;
                  if (iVar8 == local_9f0[2]) {
LAB_0010ab81:
                    pFVar4 = _stderr;
                    if (local_9dc == 1) {
                      if ((local_a68->ne[0] == local_9f0[0]) && (local_a68->ne[1] == local_9f0[1]))
                      goto code_r0x0010ae0a;
                      pcVar13 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x10abda);
                      in_stack_ffffffffffffef98 = local_9f0[0];
                      in_stack_ffffffffffffefa0 = local_9f0[1];
                      fprintf(pFVar4,
                              "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                              ,"llama_model_load",pcVar13,(ulong)(uint)local_a68->ne[0],
                              (ulong)(uint)local_a68->ne[1]);
                      local_1 = 0;
                      local_264 = 1;
                    }
                    else if (local_a5c == 0) {
                      if ((local_a68->ne[0] / (int)local_270 == local_9f0[0]) &&
                         (local_a68->ne[1] == local_9f0[1])) {
code_r0x0010ae0a:
                        switch(local_9e4) {
                        case 0:
                          local_a98 = ggml_type_size(GGML_TYPE_F32);
                          break;
                        case 1:
                          local_a98 = ggml_type_size(GGML_TYPE_F16);
                          break;
                        case 2:
                          local_a98 = ggml_type_size(GGML_TYPE_Q4_0);
                          break;
                        case 3:
                          local_a98 = ggml_type_size(GGML_TYPE_Q4_1);
                          break;
                        default:
                          fprintf(_stderr,"%s: unknown ftype %d in model file\n","llama_model_load",
                                  (ulong)local_9e4);
                          local_1 = 0;
                          local_264 = 1;
                          goto LAB_0010b52c;
                        }
                        if ((local_9dc == 1) || (local_270 == 1)) {
                          lVar25 = (long)(int)local_9f0[2];
                          iVar8 = ggml_blck_size(local_a68->type);
                          sVar21 = ggml_nbytes((ggml_tensor *)0x10af73);
                          pFVar4 = _stderr;
                          if ((lVar25 * local_a98) / (ulong)(long)iVar8 == sVar21) {
                            if (local_750 == 0) {
                              pvVar3 = local_a68->data;
                              ggml_nbytes((ggml_tensor *)0x10b050);
                              std::istream::read((char *)local_260,(long)pvVar3);
                            }
                            else {
                              sVar21 = ggml_nbytes((ggml_tensor *)0x10b088);
                              std::istream::seekg((long)local_260,(_Ios_Seekdir)sVar21);
                            }
                            sVar21 = ggml_nbytes((ggml_tensor *)0x10b0bd);
                            local_9d8 = sVar21 + local_9d8;
                            goto LAB_0010b4d5;
                          }
                          pcVar13 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)0x10afb5);
                          sVar21 = ggml_nbytes((ggml_tensor *)0x10afca);
                          fprintf(pFVar4,
                                  "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n"
                                  ,"llama_model_load",pcVar13,sVar21,
                                  (long)(int)local_9f0[2] * local_a98);
                          local_1 = 0;
                          local_264 = 1;
                        }
                        else {
                          lVar25 = (long)(int)local_9f0[2];
                          iVar8 = ggml_blck_size(local_a68->type);
                          sVar21 = ggml_nbytes((ggml_tensor *)0x10b144);
                          pFVar4 = _stderr;
                          if ((lVar25 * local_a98) / (ulong)(long)iVar8 ==
                              sVar21 / (ulong)(long)(int)local_270) {
                            if (local_a5c == 0) {
                              gVar5 = local_9f0[0];
                              iVar8 = local_a68->ne[0];
                              iVar10 = ggml_blck_size(local_a68->type);
                              sVar21 = ggml_type_size(local_a68->type);
                              for (local_aac = 0; local_aac < (int)local_9f0[1];
                                  local_aac = local_aac + 1) {
                                in_stack_ffffffffffffefe8 =
                                     (long)local_aac * (long)(iVar8 / iVar10) * sVar21;
                                iVar11 = local_750 * gVar5;
                                iVar12 = ggml_blck_size(local_a68->type);
                                in_stack_ffffffffffffefd8 =
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(long)(iVar11 / iVar12);
                                in_stack_ffffffffffffefe0 =
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)ggml_type_size(local_a68->type);
                                std::istream::read((char *)local_260,
                                                   (long)local_a68->data +
                                                   in_stack_ffffffffffffefe8 +
                                                   (long)in_stack_ffffffffffffefd8 *
                                                   (long)in_stack_ffffffffffffefe0);
                              }
                            }
                            else {
                              gVar5 = local_9f0[1];
                              in_stack_ffffffffffffefd0 = local_a68->ne[0];
                              in_stack_ffffffffffffefd4 = ggml_blck_size(local_a68->type);
                              in_stack_ffffffffffffefc0 =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(long)(in_stack_ffffffffffffefd0 / in_stack_ffffffffffffefd4);
                              sVar21 = ggml_type_size(local_a68->type);
                              lVar25 = (long)in_stack_ffffffffffffefc0 * sVar21;
                              for (local_ad4 = 0; local_ad4 < (int)local_9f0[1];
                                  local_ad4 = local_ad4 + 1) {
                                std::istream::read((char *)local_260,
                                                   (long)((long)local_a68->data +
                                                         (int)(local_ad4 + local_750 * gVar5) *
                                                         lVar25));
                              }
                            }
                            in_stack_ffffffffffffefb8 =
                                 (key_type *)ggml_nbytes((ggml_tensor *)0x10b4ac);
                            local_9d8 = (ulong)in_stack_ffffffffffffefb8 /
                                        (ulong)(long)(int)local_270 + local_9d8;
LAB_0010b4d5:
                            local_9cc = local_9cc + 1;
                            if ((int)local_9cc % 8 == 0) {
                              in_stack_ffffffffffffefb0 = (ggml_context *)&stderr;
                              fprintf(_stderr,".");
                              fflush((FILE *)((_Alloc_hider *)&in_stack_ffffffffffffefb0->mem_size)
                                             ->_M_p);
                            }
                            local_264 = 0;
                          }
                          else {
                            pcVar13 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)0x10b193);
                            sVar21 = ggml_nbytes((ggml_tensor *)0x10b1a8);
                            fprintf(pFVar4,
                                    "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n"
                                    ,"llama_model_load",pcVar13,sVar21 / (ulong)(long)(int)local_270
                                    ,(long)(int)local_9f0[2] * local_a98);
                            local_1 = 0;
                            local_264 = 1;
                          }
                        }
                      }
                      else {
                        pcVar13 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x10aca7);
                        in_stack_ffffffffffffef98 = local_9f0[0];
                        in_stack_ffffffffffffefa0 = local_9f0[1];
                        fprintf(pFVar4,
                                "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                                ,"llama_model_load",pcVar13,
                                (long)local_a68->ne[0] / (long)(int)local_270 & 0xffffffff,
                                (ulong)(uint)local_a68->ne[1]);
                        local_1 = 0;
                        local_264 = 1;
                      }
                    }
                    else {
                      if ((local_a68->ne[0] == local_9f0[0]) &&
                         (local_a68->ne[1] / (int)local_270 == local_9f0[1])) goto code_r0x0010ae0a;
                      pcVar13 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x10ad70);
                      in_stack_ffffffffffffef98 = local_9f0[0];
                      in_stack_ffffffffffffefa0 = local_9f0[1];
                      fprintf(pFVar4,
                              "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                              ,"llama_model_load",pcVar13,(ulong)(uint)local_a68->ne[0],
                              (long)local_a68->ne[1] / (long)(int)local_270 & 0xffffffff);
                      local_1 = 0;
                      local_264 = 1;
                    }
                  }
                  else {
                    pcVar13 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x10aa74);
                    fprintf(pFVar4,"%s: tensor \'%s\' has wrong size in model file\n",
                            "llama_model_load",pcVar13);
                    local_1 = 0;
                    local_264 = 1;
                  }
                }
                else {
                  iVar8 = ggml_nelements(pgVar19);
                  pFVar4 = _stderr;
                  if (iVar8 / (int)local_270 == local_9f0[2]) goto LAB_0010ab81;
                  pcVar13 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x10ab47);
                  fprintf(pFVar4,"%s: tensor \'%s\' has wrong size in model file\n",
                          "llama_model_load",pcVar13);
                  local_1 = 0;
                  local_264 = 1;
                }
              }
LAB_0010b52c:
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            } while (local_264 == 0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
            if (local_264 != 0) goto LAB_0010b64b;
          }
          local_1 = 1;
          local_264 = 1;
LAB_0010b64b:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffefb0);
        }
      }
      else {
        pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
        fprintf(pFVar4,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n",
                "llama_model_load",pcVar13,(ulong)local_27c,(ulong)*local_18);
        local_1 = 0;
        local_264 = 1;
      }
    }
    else {
      pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
      fprintf(pFVar4,"%s: invalid model file \'%s\' (bad magic)\n","llama_model_load",pcVar13);
      local_1 = 0;
      local_264 = 1;
    }
  }
  else {
    pcVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0));
    fprintf(pFVar4,"%s: failed to open \'%s\'\n","llama_model_load",pcVar13);
    local_1 = 0;
    local_264 = 1;
  }
LAB_0010b669:
  std::ifstream::~ifstream(local_260);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffefb0);
  return (bool)(local_1 & 1);
}

Assistant:

bool llama_model_load(const std::string & fname, llama_model & model, gpt_vocab & vocab, int n_ctx) {
    fprintf(stderr, "%s: loading model from '%s' - please wait ...\n", __func__, fname.c_str());

    std::vector<char> f_buf(1024*1024);

    auto fin = std::ifstream(fname, std::ios::binary);
    fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != 0x67676d6c) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    int n_ff = 0;
    int n_parts = 0;

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        //fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_mult,  sizeof(hparams.n_mult));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.n_rot,   sizeof(hparams.n_rot));
        fin.read((char *) &hparams.f16,     sizeof(hparams.f16));

        hparams.n_ctx = n_ctx;

        n_ff = ((2*(4*hparams.n_embd)/3 + hparams.n_mult - 1)/hparams.n_mult)*hparams.n_mult;
        n_parts = LLAMA_N_PARTS.at(hparams.n_embd);

        // fprintf(stderr, "%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        // fprintf(stderr, "%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        // fprintf(stderr, "%s: n_embd  = %d\n", __func__, hparams.n_embd);
        // fprintf(stderr, "%s: n_mult  = %d\n", __func__, hparams.n_mult);
        // fprintf(stderr, "%s: n_head  = %d\n", __func__, hparams.n_head);
        // fprintf(stderr, "%s: n_layer = %d\n", __func__, hparams.n_layer);
        // fprintf(stderr, "%s: n_rot   = %d\n", __func__, hparams.n_rot);
        // fprintf(stderr, "%s: f16     = %d\n", __func__, hparams.f16);
        // fprintf(stderr, "%s: n_ff    = %d\n", __func__, n_ff);
        // fprintf(stderr, "%s: n_parts = %d\n", __func__, n_parts);
    }

    // load vocab
    {
        const int32_t n_vocab = model.hparams.n_vocab;

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            word.resize(len);
            fin.read((char *) word.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;

            //if (i < 30000) {
            //    fprintf(stderr, "%s: vocab[%d] = '%s'\n", __func__, i, word.c_str());
            //}
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = GGML_TYPE_COUNT;
    switch (model.hparams.f16) {
        case 0: wtype = GGML_TYPE_F32;  break;
        case 1: wtype = GGML_TYPE_F16;  break;
        case 2: wtype = GGML_TYPE_Q4_0; break;
        case 3: wtype = GGML_TYPE_Q4_1; break;
        default:
                {
                    fprintf(stderr, "%s: invalid model file '%s' (bad f16 value %d)\n",
                            __func__, fname.c_str(), model.hparams.f16);
                    return false;
                }
    }

    const ggml_type wtype2 = GGML_TYPE_F32;

    auto & ctx = model.ctx;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // tok_embeddings

        ctx_size += n_embd*ggml_type_sizef(GGML_TYPE_F32); // norm

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // output

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // attention_norm

        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wq
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wk
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wv
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wo

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // ffn_norm

        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w1
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w2
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w3

        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_k
        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_v

        ctx_size += (5 + 10*n_layer)*256; // object overhead

        fprintf(stderr, "%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
        };

        model.ctx = ggml_init(params);
        if (!model.ctx) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.tok_embeddings = ggml_new_tensor_2d(ctx, wtype, n_embd, n_vocab);

        model.norm   = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.output = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["tok_embeddings.weight"] = model.tok_embeddings;

        model.tensors["norm.weight"]   = model.norm;
        model.tensors["output.weight"] = model.output;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.attention_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.wq = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wk = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wv = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wo = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);

            layer.ffn_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.w1 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);
            layer.w2 = ggml_new_tensor_2d(ctx, wtype,   n_ff, n_embd);
            layer.w3 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);

            // map by name
            model.tensors["layers." + std::to_string(i) + ".attention_norm.weight"] = layer.attention_norm;

            model.tensors["layers." + std::to_string(i) + ".attention.wq.weight"] = layer.wq;
            model.tensors["layers." + std::to_string(i) + ".attention.wk.weight"] = layer.wk;
            model.tensors["layers." + std::to_string(i) + ".attention.wv.weight"] = layer.wv;
            model.tensors["layers." + std::to_string(i) + ".attention.wo.weight"] = layer.wo;

            model.tensors["layers." + std::to_string(i) + ".ffn_norm.weight"] = layer.ffn_norm;

            model.tensors["layers." + std::to_string(i) + ".feed_forward.w1.weight"] = layer.w1;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w2.weight"] = layer.w2;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w3.weight"] = layer.w3;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        fprintf(stderr, "%s: memory_size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    const size_t file_offset = fin.tellg();

    fin.close();

    std::vector<uint8_t> tmp;
    
    for (int i = 0; i < n_parts; ++i) {
        const int part_id = i;
        //const int part_id = n_parts - i - 1;

        std::string fname_part = fname;
        if (i > 0) {
            fname_part += "." + std::to_string(i);
        }

        fprintf(stderr, "%s: loading model part %d/%d from '%s'\n", __func__, i+1, n_parts, fname_part.c_str());

        fin = std::ifstream(fname_part, std::ios::binary);
        fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
        fin.seekg(file_offset);

        // load weights
        {
            int n_tensors = 0;
            size_t total_size = 0;

            fprintf(stderr, "%s: ", __func__);

            while (true) {
                int32_t n_dims;
                int32_t length;
                int32_t ftype;

                fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
                fin.read(reinterpret_cast<char *>(&length), sizeof(length));
                fin.read(reinterpret_cast<char *>(&ftype),  sizeof(ftype));

                if (fin.eof()) {
                    break;
                }

                int32_t nelements = 1;
                int32_t ne[2] = { 1, 1 };
                for (int i = 0; i < n_dims; ++i) {
                    fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                    nelements *= ne[i];
                }

                std::string name(length, 0);
                fin.read(&name[0], length);

                if (model.tensors.find(name.data()) == model.tensors.end()) {
                    fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.data());
                    return false;
                }

                // split_type = 0: split by columns
                // split_type = 1: split by rows
                int split_type = 0;

                // split_type = 0:
                // regex:
                //   - tok_embeddings.*
                //   - layers.*.attention.wo.weight
                //   - layers.*.feed_forward.w2.weight

                // split_type = 1:
                // regex:
                //   - output.*
                //   - layers.*.attention.wq.weight
                //   - layers.*.attention.wk.weight
                //   - layers.*.attention.wv.weight
                //   - layers.*.feed_forward.w1.weight
                //   - layers.*.feed_forward.w3.weight
                if (name.find("tok_embeddings") != std::string::npos) {
                    split_type = 0;
                } else if (name.find("layers") != std::string::npos) {
                    if (name.find("attention.wo.weight") != std::string::npos) {
                        split_type = 0;
                    } else if (name.find("feed_forward.w2.weight") != std::string::npos) {
                        split_type = 0;
                    } else {
                        split_type = 1;
                    }
                } else if (name.find("output") != std::string::npos) {
                    split_type = 1;
                }

                auto tensor = model.tensors[name.data()];

                if (n_dims == 1) {
                    if (ggml_nelements(tensor) != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                } else {
                    if (ggml_nelements(tensor)/n_parts != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                }

                if (n_dims == 1) {
                    if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                        fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                __func__, name.data(), tensor->ne[0], tensor->ne[1], ne[0], ne[1]);
                        return false;
                    }
                } else {
                    if (split_type == 0) {
                        if (tensor->ne[0]/n_parts != ne[0] || tensor->ne[1] != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0]/n_parts, tensor->ne[1], ne[0], ne[1]);
                            return false;
                        }
                    } else {
                        if (tensor->ne[0] != ne[0] || tensor->ne[1]/n_parts != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0], tensor->ne[1]/n_parts, ne[0], ne[1]);
                            return false;
                        }
                    }
                }

                if (0) {
                    static const char * ftype_str[] = { "f32", "f16", "q4_0", "q4_1", };
                    fprintf(stderr, "%24s - [%5d, %5d], type = %6s, split = %d\n", name.data(), ne[0], ne[1], ftype_str[ftype], split_type);
                }

                size_t bpe = 0;

                switch (ftype) {
                    case 0: bpe = ggml_type_size(GGML_TYPE_F32);  break;
                    case 1: bpe = ggml_type_size(GGML_TYPE_F16);  break;
                    case 2: bpe = ggml_type_size(GGML_TYPE_Q4_0); assert(ne[0] % 64 == 0); break;
                    case 3: bpe = ggml_type_size(GGML_TYPE_Q4_1); assert(ne[0] % 64 == 0); break;
                    default:
                            {
                                fprintf(stderr, "%s: unknown ftype %d in model file\n", __func__, ftype);
                                return false;
                            }
                };

                if (n_dims == 1 || n_parts == 1) {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor), nelements*bpe);
                        return false;
                    }

                    if (part_id == 0) {
                        fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
                    } else {
                        fin.seekg(ggml_nbytes(tensor), std::ios::cur);
                    }

                    total_size += ggml_nbytes(tensor);
                } else {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)/n_parts) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor)/n_parts, nelements*bpe);
                        return false;
                    }

                    if (split_type == 0) {
                        const int np0 = ne[0];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                        assert(row_size == tensor->nb[1]);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = i1*row_size;
                            const size_t offset = offset_row + ((part_id*np0)/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset, row_size/n_parts);
                        }
                    } else {
                        const int np1 = ne[1];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = (i1 + part_id*np1)*row_size;
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset_row, row_size);
                        }
                    }

                    total_size += ggml_nbytes(tensor)/n_parts;
                }

                //fprintf(stderr, "%42s - [%5d, %5d], type = %6s, %6.2f MB\n", name.data(), ne[0], ne[1], ftype == 0 ? "float" : "f16", ggml_nbytes(tensor)/1024.0/1024.0);
                if (++n_tensors % 8 == 0) {
                    fprintf(stderr, ".");
                    fflush(stderr);
                }
            }

            fprintf(stderr, " done\n");

            fprintf(stderr, "%s: model size = %8.2f MB / num tensors = %d\n", __func__, total_size/1024.0/1024.0, n_tensors);
        }

        fin.close();
    }

    return true;
}